

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::setLocale_helper(QWidgetPrivate *this,QLocale *loc,bool forceUpdate)

{
  byte bVar1;
  bool bVar2;
  QWidget *pQVar3;
  QObject *o;
  qsizetype qVar4;
  QWidget *this_00;
  byte in_DL;
  QWidgetPrivate *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  int i;
  QWidget *q;
  QEvent e;
  QLocale *in_stack_ffffffffffffffa8;
  int local_3c;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  pQVar3 = q_func(in_RDI);
  bVar2 = ::operator==((QLocale *)in_RDI,in_stack_ffffffffffffffa8);
  if ((!bVar2) || ((bVar1 & 1) != 0)) {
    QLocale::operator=(&in_RDI->locale,(QLocale *)in_RSI);
    bVar2 = QList<QObject_*>::isEmpty((QList<QObject_*> *)0x371138);
    if (!bVar2) {
      local_3c = 0;
      while( true ) {
        o = (QObject *)(long)local_3c;
        qVar4 = QList<QObject_*>::size((QList<QObject_*> *)&in_RDI->field_0x18);
        if (qVar4 <= (long)o) break;
        QList<QObject_*>::at((QList<QObject_*> *)in_RDI,(qsizetype)o);
        this_00 = qobject_cast<QWidget*>(o);
        if (((this_00 != (QWidget *)0x0) &&
            (bVar2 = QWidget::testAttribute(this_00,(WidgetAttribute)((ulong)in_RDI >> 0x20)),
            !bVar2)) &&
           ((bVar2 = QWidget::isWindow((QWidget *)in_RDI), !bVar2 ||
            (bVar2 = QWidget::testAttribute(this_00,(WidgetAttribute)((ulong)in_RDI >> 0x20)), bVar2
            )))) {
          QWidget::d_func((QWidget *)0x3711df);
          setLocale_helper(in_RSI,(QLocale *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),
                           SUB81((ulong)pQVar3 >> 0x38,0));
        }
        local_3c = local_3c + 1;
      }
    }
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_18,LocaleChange);
    QCoreApplication::sendEvent(&pQVar3->super_QObject,(QEvent *)&local_18);
    QEvent::~QEvent((QEvent *)&local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::setLocale_helper(const QLocale &loc, bool forceUpdate)
{
    Q_Q(QWidget);
    if (locale == loc && !forceUpdate)
        return;

    locale = loc;

    if (!children.isEmpty()) {
        for (int i = 0; i < children.size(); ++i) {
            QWidget *w = qobject_cast<QWidget*>(children.at(i));
            if (!w)
                continue;
            if (w->testAttribute(Qt::WA_SetLocale))
                continue;
            if (w->isWindow() && !w->testAttribute(Qt::WA_WindowPropagation))
                continue;
            w->d_func()->setLocale_helper(loc, forceUpdate);
        }
    }
    QEvent e(QEvent::LocaleChange);
    QCoreApplication::sendEvent(q, &e);
}